

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

string * google::protobuf::internal::SubMessagePrefix
                   (string *__return_storage_ptr__,string *prefix,FieldDescriptor *field,int index)

{
  int i;
  string sStack_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)prefix);
  if (field[0x34] == (FieldDescriptor)0x1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  if (index != -1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    SimpleItoa_abi_cxx11_(&sStack_38,(protobuf *)(ulong)(uint)index,i);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string SubMessagePrefix(const string& prefix,
                               const FieldDescriptor* field,
                               int index) {
  string result(prefix);
  if (field->is_extension()) {
    result.append("(");
    result.append(field->full_name());
    result.append(")");
  } else {
    result.append(field->name());
  }
  if (index != -1) {
    result.append("[");
    result.append(SimpleItoa(index));
    result.append("]");
  }
  result.append(".");
  return result;
}